

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TParseContext::vkRelaxedRemapDotDereference
          (TParseContext *this,TSourceLoc *param_1,TIntermTyped *base,TType *member,
          TString *identifier)

{
  TString *this_00;
  TIntermediate *this_01;
  int iVar1;
  TSymbol *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AccessChainTraverser traverser;
  AccessChainTraverser AStack_88;
  
  iVar1 = (*member->_vptr_TType[0x28])(member);
  if ((char)iVar1 != '\0') {
    AccessChainTraverser::AccessChainTraverser(&AStack_88);
    (*(base->super_TIntermNode)._vptr_TIntermNode[2])(base,&AStack_88);
    this_00 = &AStack_88.path;
    if (AStack_88.path._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,".");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,(identifier->_M_dataplus)._M_p,identifier->_M_string_length);
    pTVar2 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,this_00,(bool *)0x0,
                                (bool *)0x0,(int *)0x0);
    if (pTVar2 != (TSymbol *)0x0) {
      this_01 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar1 = (*pTVar2->_vptr_TSymbol[10])(pTVar2);
      base = &TIntermediate::addSymbol(this_01,(TVariable *)CONCAT44(extraout_var,iVar1))->
              super_TIntermTyped;
      iVar1 = (*pTVar2->_vptr_TSymbol[0xc])(pTVar2);
      (*(((TIntermSymbol *)base)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
                (base,CONCAT44(extraout_var_00,iVar1));
    }
  }
  return &((TIntermSymbol *)base)->super_TIntermTyped;
}

Assistant:

TIntermTyped* TParseContext::vkRelaxedRemapDotDereference(const TSourceLoc&, TIntermTyped& base, const TType& member,
    const TString& identifier)
{
    if (!member.isOpaque())
        return &base;

    AccessChainTraverser traverser{};
    base.traverse(&traverser);
    if (!traverser.path.empty())
        traverser.path.append(".");
    traverser.path.append(identifier);

    const TSymbol* symbol = symbolTable.find(traverser.path);
    if (!symbol)
        return &base;

    TIntermTyped* result = intermediate.addSymbol(*symbol->getAsVariable());
    result->setType(symbol->getType());
    return result;
}